

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeGlobals(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *this_00;
  Index IVar1;
  pointer this_01;
  U32LEB local_24;
  Index *local_20;
  uint local_18;
  int32_t local_14;
  Index num;
  int32_t start;
  WasmBinaryWriter *this_local;
  
  _num = this;
  this_01 = std::unique_ptr<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>::operator->
                      (&this->importInfo);
  IVar1 = ImportInfo::getNumDefinedGlobals(this_01);
  if (IVar1 != 0) {
    local_14 = startSection<wasm::BinaryConsts::Section>(this,Global);
    local_18 = 0;
    local_20 = &local_18;
    wasm::ModuleUtils::iterDefinedGlobals<wasm::WasmBinaryWriter::writeGlobals()::__0>
              (this->wasm,(anon_class_8_1_ba1d66e6)local_20);
    this_00 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_24,local_18);
    BufferWithRandomAccess::operator<<(this_00,local_24);
    wasm::ModuleUtils::iterDefinedGlobals<wasm::WasmBinaryWriter::writeGlobals()::__1>
              (this->wasm,(anon_class_8_1_8991fb9c)this);
    finishSection(this,local_14);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeGlobals() {
  if (importInfo->getNumDefinedGlobals() == 0) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Global);
  // Count and emit the total number of globals after tuple globals have been
  // expanded into their constituent parts.
  Index num = 0;
  ModuleUtils::iterDefinedGlobals(
    *wasm, [&num](Global* global) { num += global->type.size(); });
  o << U32LEB(num);
  ModuleUtils::iterDefinedGlobals(*wasm, [&](Global* global) {
    size_t i = 0;
    for (const auto& t : global->type) {
      writeType(t);
      o << U32LEB(global->mutable_);
      if (global->type.size() == 1) {
        writeExpression(global->init);
      } else if (auto* make = global->init->dynCast<TupleMake>()) {
        // Emit the proper lane for this global.
        writeExpression(make->operands[i]);
      } else {
        // For now tuple globals must contain tuple.make. We could perhaps
        // support more operations, like global.get, but the code would need to
        // look something like this:
        //
        //   auto parentIndex = getGlobalIndex(get->name);
        //   o << int8_t(BinaryConsts::GlobalGet) << U32LEB(parentIndex + i);
        //
        // That is, we must emit the instruction here, and not defer to
        // writeExpression, as writeExpression writes an entire expression at a
        // time (and not just one of the lanes). As emitting an instruction here
        // is less clean, and there is no important use case for global.get of
        // one tuple global to another, we disallow this.
        WASM_UNREACHABLE("unsupported tuple global operation");
      }
      o << int8_t(BinaryConsts::End);
      ++i;
    }
  });
  finishSection(start);
}